

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar6 = (ulong)seed;
  if ((uint)len < 0x20) {
    lVar2 = uVar6 + 0x27d4eb2f165667c5;
  }
  else {
    puVar1 = (uint *)((long)key + (long)len + -0x20);
    uVar9 = uVar6 + 0x60ea27eeadc0b5d6;
    uVar5 = uVar6 + 0xc2b2ae3d27d4eb4f;
    uVar3 = uVar6 + 0x61c8864e7a143579;
    do {
      uVar9 = *key * -0x3d4d51c2d82b14b1 + uVar9;
      uVar4 = uVar9 >> 0x21 | uVar9 * 0x80000000;
      uVar9 = uVar4 * -0x61c8864e7a143579;
      uVar5 = *(long *)((long)key + 8) * -0x3d4d51c2d82b14b1 + uVar5;
      uVar8 = uVar5 >> 0x21 | uVar5 * 0x80000000;
      uVar5 = uVar8 * -0x61c8864e7a143579;
      uVar6 = *(long *)((long)key + 0x10) * -0x3d4d51c2d82b14b1 + uVar6;
      uVar10 = uVar6 >> 0x21 | uVar6 * 0x80000000;
      uVar6 = uVar10 * -0x61c8864e7a143579;
      uVar3 = *(long *)((long)key + 0x18) * -0x3d4d51c2d82b14b1 + uVar3;
      uVar7 = uVar3 >> 0x21 | uVar3 * 0x80000000;
      uVar3 = uVar7 * -0x61c8864e7a143579;
      key = (void *)((long)key + 0x20);
    } while (key <= puVar1);
    lVar2 = ((uVar7 * -0x210ca4fef0869357 >> 0x21 | uVar7 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar10 * -0x210ca4fef0869357 >> 0x21 | uVar10 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar8 * -0x210ca4fef0869357 >> 0x21 | uVar8 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar4 * -0x210ca4fef0869357 >> 0x21 | uVar4 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            (uVar3 >> 0x2e | uVar7 * -0x1939e850d5e40000) +
            (uVar6 >> 0x34 | uVar10 * 0x779b185ebca87000) +
            (uVar5 >> 0x39 | uVar8 * 0x1bbcd8c2f5e54380) +
            (uVar9 >> 0x3f | uVar4 * 0x3c6ef3630bd7950e)) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63
            ) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63
            ) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  uVar6 = lVar2 + len;
  for (uVar5 = (ulong)(len & 0x1f); 7 < uVar5; uVar5 = uVar5 - 8) {
    uVar6 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
            -0x61c8864e7a143579 ^ uVar6;
    key = (void *)((long)key + 8);
    uVar6 = (uVar6 >> 0x25 | uVar6 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  if (3 < uVar5) {
    uVar6 = (ulong)*key * -0x61c8864e7a143579 ^ uVar6;
    key = (void *)((long)key + 4);
    uVar6 = (uVar6 >> 0x29 | uVar6 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar5 = uVar5 - 4;
  }
  if (uVar5 != 0) {
    uVar3 = 0;
    do {
      uVar6 = (ulong)*(byte *)((long)key + uVar3) * 0x27d4eb2f165667c5 ^ uVar6;
      uVar6 = (uVar6 >> 0x35 | uVar6 << 0xb) * -0x61c8864e7a143579;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3d4d51c2d82b14b1;
  uVar6 = (uVar6 >> 0x1d ^ uVar6) * 0x165667b19e3779f9;
  *(ulong *)out = uVar6 >> 0x20 ^ uVar6;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}